

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonCdataBlock(void *user_data,xmlChar *ch,int len)

{
  int iVar1;
  long lVar2;
  int local_34;
  PyObject *pPStack_30;
  int type;
  PyObject *result;
  PyObject *handler;
  int len_local;
  xmlChar *ch_local;
  void *user_data_local;
  
  pPStack_30 = (PyObject *)0x0;
  local_34 = 0;
  iVar1 = PyObject_HasAttrString(user_data,"cdataBlock");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"cdata");
    if (iVar1 != 0) {
      local_34 = 2;
    }
  }
  else {
    local_34 = 1;
  }
  if (local_34 != 0) {
    if (local_34 == 1) {
      pPStack_30 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"cdataBlock","s#",ch,(long)len);
    }
    else if (local_34 == 2) {
      pPStack_30 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"cdata","s#",ch,(long)len);
    }
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(pPStack_30);
  }
  return;
}

Assistant:

static void
pythonCdataBlock(void *user_data, const xmlChar * ch, int len)
{
    PyObject *handler;
    PyObject *result = NULL;
    int type = 0;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "cdataBlock"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "cdata"))
        type = 2;
    if (type != 0) {
        if (type == 1)
            result =
                PyObject_CallMethod(handler, (char *) "cdataBlock",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        else if (type == 2)
            result =
                PyObject_CallMethod(handler, (char *) "cdata",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}